

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_analysis.cc
# Opt level: O2

void __thiscall pass_non_synthesizable_Test::TestBody(pass_non_synthesizable_Test *this)

{
  bool bVar1;
  Generator *this_00;
  undefined1 local_1d0 [8];
  Context c;
  shared_ptr<kratos::DPIFunctionStmtBlock> dpi;
  shared_ptr<kratos::CombinationalStmtBlock> comb;
  shared_ptr<kratos::FunctionCallStmt> stmt;
  AssertHelper local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Base_ptr local_38;
  _Alloc_hider local_30;
  
  kratos::Context::Context((Context *)local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"mod",
             (allocator<char> *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  this_00 = kratos::Context::generator((Context *)local_1d0,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  kratos::Generator::combinational
            ((Generator *)
             &dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"test_dpi",
             (allocator<char> *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::Generator::dpi_function
            ((Generator *)&c.tracked_generators_._M_h._M_single_bucket,(string *)this_00);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,"test_dpi",
             (allocator<char> *)
             &comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_48._8_8_ = local_58 + 8;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (pointer)0x0;
  local_48._M_allocated_capacity = 0;
  local_30._M_p = (pointer)0x0;
  local_38 = (_Base_ptr)local_48._8_8_;
  kratos::Generator::call
            (this_00,(string *)
                     &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
              *)local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)local_58);
  std::__cxx11::string::~string
            ((string *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::Var::as<kratos::FunctionCallVar>((Var *)local_58);
  std::make_shared<kratos::FunctionCallStmt,std::shared_ptr<kratos::FunctionCallVar>>
            ((shared_ptr<kratos::FunctionCallVar> *)
             &comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::FunctionCallStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_58,
             (__shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             dpi.super___shared_ptr<kratos::DPIFunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  local_58._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc";
  local_58._8_4_ = 0x23;
  std::
  vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
  ::emplace_back<std::pair<char_const*,int>>
            ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              *)&(comb.
                  super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count,(pair<const_char_*,_int> *)local_58);
  local_58._0_8_ = &local_48;
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_58._8_8_ = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    kratos::check_non_synthesizable_content(this_00);
  }
  std::__cxx11::string::assign(local_58);
  testing::Message::Message
            ((Message *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_analysis.cc"
             ,0x26,(char *)local_58._0_8_);
  testing::internal::AssertHelper::operator=
            (&local_60,
             (Message *)
             &stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if (stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(stmt.super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_vptr__Sp_counted_base[1])();
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&dpi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&comb);
  kratos::Context::~Context((Context *)local_1d0);
  return;
}

Assistant:

TEST(pass, non_synthesizable) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto comb = mod.combinational();
    auto dpi = mod.dpi_function("test_dpi");
    auto &call = mod.call("test_dpi", std::map<std::string, std::shared_ptr<Var>>{});
    auto stmt = std::make_shared<FunctionCallStmt>(call.as<FunctionCallVar>());
    comb->add_stmt(stmt);
    // add debug info
    stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));

    // run the pass
    EXPECT_THROW(check_non_synthesizable_content(&mod), UserException);
}